

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QMap<QString,_QVariant>_>::moveAppend
          (QGenericArrayOps<QMap<QString,_QVariant>_> *this,QMap<QString,_QVariant> *b,
          QMap<QString,_QVariant> *e)

{
  qsizetype *pqVar1;
  QMap<QString,_QVariant> *pQVar2;
  long lVar3;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar4;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QMap<QString,_QVariant>_>).ptr;
    for (; b < e; b = b + 1) {
      lVar3 = (this->super_QArrayDataPointer<QMap<QString,_QVariant>_>).size;
      pQVar4 = (b->d).d.ptr;
      (b->d).d.ptr = (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                      *)0x0;
      pQVar2[lVar3].d.d.ptr = pQVar4;
      pqVar1 = &(this->super_QArrayDataPointer<QMap<QString,_QVariant>_>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }